

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void units::reduce_number_length(string *unit_string,char detect)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong loc;
  size_t length;
  string *psVar6;
  ulong uVar7;
  char cVar8;
  ulong uVar9;
  
  if ((reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   zstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,
               "00000","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_);
  }
  if ((reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&reduce_number_length(std::__cxx11::string&,char)::
                                   nstring_abi_cxx11_), iVar3 != 0)) {
    reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,
               "99999","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_);
  }
  psVar6 = &reduce_number_length(std::__cxx11::string&,char)::nstring_abi_cxx11_;
  if (detect == '0') {
    psVar6 = &reduce_number_length(std::__cxx11::string&,char)::zstring_abi_cxx11_;
  }
  uVar4 = std::__cxx11::string::find((char *)unit_string,(ulong)(psVar6->_M_dataplus)._M_p,0);
  if (uVar4 != 0xffffffffffffffff) {
    do {
      uVar9 = uVar4 + 5;
      cVar8 = (char)unit_string;
      uVar5 = std::__cxx11::string::find_first_not_of(cVar8,(ulong)(uint)(int)detect);
      if (uVar5 == 0xffffffffffffffff) {
        if (detect != '9') {
          uVar9 = unit_string->_M_string_length;
          uVar5 = std::__cxx11::string::rfind(cVar8,0x2e);
          if (uVar5 != 0xffffffffffffffff) {
            loc = uVar4 - 1;
            pcVar2 = (unit_string->_M_dataplus)._M_p;
            uVar7 = loc;
            if (uVar5 == loc) {
              do {
                do {
                  uVar4 = uVar7;
                  uVar7 = 0;
                } while (uVar4 == 0);
                cVar8 = pcVar2[uVar4 - 1];
                if (9 < (byte)(cVar8 - 0x30U)) goto LAB_001eb7d9;
                uVar7 = uVar4 - 1;
              } while (cVar8 == '0');
LAB_001eb78a:
              length = ~loc;
              goto LAB_001eb7c8;
            }
            do {
              uVar5 = uVar5 + 1;
              loc = uVar4;
              if (uVar4 <= uVar5) goto LAB_001eb78a;
            } while ((byte)(pcVar2[uVar5] - 0x30U) < 10);
          }
        }
      }
      else {
        uVar9 = uVar5 + 1;
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        cVar1 = pcVar2[uVar5];
        if (((cVar1 != '.') &&
            (((9 < (byte)(cVar1 - 0x30U) ||
              ((uVar9 < unit_string->_M_string_length &&
               (uVar5 = uVar9, 9 < (byte)(pcVar2[uVar9] - 0x30U))))) &&
             (loc = std::__cxx11::string::rfind(cVar8,0x2e), loc != 0xffffffffffffffff)))) &&
           (length = uVar5 - loc, 0xc < length)) {
          pcVar2 = (unit_string->_M_dataplus)._M_p;
          uVar7 = loc;
          if (loc == uVar4 - 1) {
            do {
              if ((uVar7 == 0) || (cVar8 = pcVar2[uVar7 - 1], 9 < (byte)(cVar8 - 0x30U)))
              goto LAB_001eb7d9;
              uVar7 = uVar7 - 1;
            } while (cVar8 == '0');
LAB_001eb7c8:
            shorten_number(unit_string,loc,length);
            uVar9 = loc + 1;
          }
          else {
            do {
              loc = loc + 1;
              if (uVar4 <= loc) {
                length = uVar5 - uVar4;
                loc = uVar4;
                goto LAB_001eb7c8;
              }
            } while ((byte)(pcVar2[loc] - 0x30U) < 10);
          }
        }
      }
LAB_001eb7d9:
      uVar4 = std::__cxx11::string::find
                        ((char *)unit_string,(ulong)(psVar6->_M_dataplus)._M_p,uVar9);
    } while (uVar4 != 0xffffffffffffffff);
  }
  return;
}

Assistant:

static void reduce_number_length(std::string& unit_string, char detect)
{
    static const std::string zstring("00000");
    static const std::string nstring("99999");
    const std::string& detseq(detect == '0' ? zstring : nstring);
    // search for a bunch of zeros in a row
    std::size_t indexingloc{0};

    auto zloc = unit_string.find(detseq);
    while (zloc != std::string::npos) {
        auto nloc = unit_string.find_first_not_of(detect, zloc + 5);
        indexingloc = zloc + 5;
        if (nloc != std::string::npos) {
            indexingloc = nloc + 1;
            if (unit_string[nloc] != '.') {
                if (!isDigitCharacter(unit_string[nloc]) ||
                    (unit_string.size() > nloc + 1 &&
                     !isDigitCharacter(unit_string[nloc + 1]))) {
                    if (isDigitCharacter(unit_string[nloc])) {
                        ++nloc;
                    }

                    auto dloc = unit_string.find_last_of('.', zloc);

                    if (dloc != std::string::npos && nloc - dloc > 12) {
                        bool valid = true;
                        if (dloc == zloc - 1) {
                            --zloc;
                            auto ploc = dloc;
                            valid = false;
                            while (true) {
                                if (ploc <= 0) {
                                    break;
                                }
                                --ploc;
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    break;
                                }
                                if (unit_string[ploc] != '0') {
                                    valid = true;
                                    break;
                                }
                            }
                        } else {
                            auto ploc = dloc + 1;
                            while (ploc < zloc) {
                                if (!isDigitCharacter(unit_string[ploc])) {
                                    valid = false;
                                    break;
                                }
                                ++ploc;
                            }
                        }
                        if (valid) {
                            shorten_number(unit_string, zloc, nloc - zloc);
                            indexingloc = zloc + 1;
                        }
                    }
                }
            }
        } else if (detect != '9') {
            indexingloc = unit_string.size();
            auto dloc = unit_string.find_last_of('.', zloc);

            if (dloc != std::string::npos) {
                bool valid = true;
                if (dloc == zloc - 1) {
                    --zloc;
                    auto ploc = dloc;
                    valid = false;
                    while (true) {
                        if (ploc > 0) {
                            --ploc;
                            if (!isDigitCharacter(unit_string[ploc])) {
                                break;
                            }
                            if (unit_string[ploc] != '0') {
                                valid = true;
                                break;
                            }
                        }
                    }
                } else {
                    auto ploc = dloc + 1;
                    while (ploc < zloc) {
                        if (!isDigitCharacter(unit_string[ploc])) {
                            valid = false;
                            break;
                        }
                        ++ploc;
                    }
                }
                if (valid) {
                    shorten_number(unit_string, zloc, nloc - zloc);
                    indexingloc = zloc + 1;
                }
            }
        }
        zloc = unit_string.find(detseq, indexingloc);
    }
}